

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableProtoObjectWalker::FindPropertyAddress::AutoCleanup::~AutoCleanup(AutoCleanup *this)

{
  if (this->walker != (IDiagObjectModelWalkerBase *)0x0) {
    Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::ReleaseStrongReference
              (this->walkerRef);
  }
  if (this->walkerRef != (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>>
              (&Memory::HeapAllocator::Instance,this->walkerRef);
  }
  return;
}

Assistant:

~AutoCleanup()
            {
                if (walker)
                {
                    walkerRef->ReleaseStrongReference();
                }
                if (walkerRef)
                {
                    HeapDelete(walkerRef);
                }
            }